

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O2

int history_def_del(void *p,HistEvent *ev,int num)

{
  HistEvent *ev_00;
  int iVar1;
  char *pcVar2;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  
  iVar1 = history_def_set(p,ev,num);
  if (iVar1 == 0) {
    ev_00 = *(HistEvent **)((long)p + 0x28);
    pcVar2 = strdup(ev_00->str);
    ev->str = pcVar2;
    ev->num = ev_00->num;
    history_def_delete((history_t *)p,ev_00,(hentry_t_conflict *)CONCAT44(extraout_var,extraout_EDX)
                      );
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int
history_def_del(void *p, TYPE(HistEvent) *ev __attribute__((__unused__)),
    const int num)
{
	history_t *h = (history_t *) p;
	if (history_def_set(h, ev, num) != 0)
		return -1;
	ev->str = Strdup(h->cursor->ev.str);
	ev->num = h->cursor->ev.num;
	history_def_delete(h, ev, h->cursor);
	return 0;
}